

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Vec_Int_t * Abc_NtkFanoutCounts(Abc_Ntk_t *pNtk)

{
  Vec_Int_t *p;
  Abc_Obj_t *pAVar1;
  uint uVar2;
  int i;
  
  p = Vec_IntAlloc(0);
  Vec_IntFill(p,pNtk->vObjs->nSize,-1);
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar1 = Abc_NtkObj(pNtk,i);
    if (((pAVar1 != (Abc_Obj_t *)0x0) && (uVar2 = *(uint *)&pAVar1->field_0x14 & 0xf, uVar2 < 8)) &&
       ((0xa4U >> uVar2 & 1) != 0)) {
      Vec_IntWriteEntry(p,i,(pAVar1->vFanouts).nSize);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkFanoutCounts( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vFanNums;
    Abc_Obj_t * pObj;
    int i;
    vFanNums = Vec_IntAlloc( 0 );
    Vec_IntFill( vFanNums, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) )
            Vec_IntWriteEntry( vFanNums, i, Abc_ObjFanoutNum(pObj) );
    return vFanNums;
}